

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int *piVar1;
  ImGuiStoragePair *pIVar2;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar3;
  int iVar4;
  ImGuiStoragePair *__dest;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  __dest = this->Data;
  lVar7 = (long)it - (long)__dest;
  iVar4 = this->Size;
  if (iVar4 == this->Capacity) {
    if (iVar4 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar4 / 2 + iVar4;
    }
    iVar8 = iVar4 + 1;
    if (iVar4 + 1 < iVar5) {
      iVar8 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar8 << 4,GImAllocatorUserData);
    if (this->Data != (ImGuiStoragePair *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size << 4);
      pIVar2 = this->Data;
      if ((pIVar2 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    this->Data = __dest;
    this->Capacity = iVar8;
    iVar4 = this->Size;
  }
  lVar6 = (long)iVar4 - (lVar7 >> 4);
  if (lVar6 != 0 && lVar7 >> 4 <= (long)iVar4) {
    memmove((void *)((long)__dest + lVar7 + 0x10),(void *)((long)__dest + lVar7),lVar6 * 0x10);
    __dest = this->Data;
  }
  aVar3 = v->field_1;
  *(undefined8 *)((long)__dest + lVar7) = *(undefined8 *)v;
  *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((undefined8 *)((long)__dest + lVar7) + 1) =
       aVar3;
  this->Size = this->Size + 1;
  return (ImGuiStoragePair *)(lVar7 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }